

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemViewPrivate::disconnectAll(QAbstractItemViewPrivate *this)

{
  byte bVar1;
  QObject *pQVar2;
  Data *pDVar3;
  QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
  *pQVar4;
  Entry *pEVar5;
  ulong uVar6;
  _Rb_tree_node_base *p_Var7;
  QObject *pQVar8;
  Data *pDVar9;
  _Base_ptr p_Var10;
  long lVar11;
  _Rb_tree_node_base *p_Var12;
  ulong uVar13;
  QObject *pQVar14;
  long in_FS_OFFSET;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  lVar11 = 0x4a0;
  do {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar11));
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x510);
  lVar11 = 0x510;
  do {
    QObject::disconnect((Connection *)
                        (&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                          super_QWidgetPrivate.super_QObjectPrivate + lVar11));
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x530);
  pDVar3 = (this->itemDelegate).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = (this->itemDelegate).wp.value;
  }
  disconnectDelegate(this,(QAbstractItemDelegate *)pQVar8);
  pQVar4 = (this->rowDelegates).d.d.ptr;
  if (pQVar4 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var7 = *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var12 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar4 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var7 != p_Var12; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) || (*(int *)&(p_Var7[1]._M_parent)->field_0x4 == 0))
    {
      p_Var10 = (_Base_ptr)0x0;
    }
    else {
      p_Var10 = p_Var7[1]._M_left;
    }
    disconnectDelegate(this,(QAbstractItemDelegate *)p_Var10);
  }
  pQVar4 = (this->columnDelegates).d.d.ptr;
  if (pQVar4 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var7 = *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var12 = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar4 == (QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>
                 *)0x0) {
    p_Var12 = (_Rb_tree_node_base *)0x0;
  }
  for (; p_Var7 != p_Var12; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    if ((p_Var7[1]._M_parent == (_Base_ptr)0x0) || (*(int *)&(p_Var7[1]._M_parent)->field_0x4 == 0))
    {
      p_Var10 = (_Base_ptr)0x0;
    }
    else {
      p_Var10 = p_Var7[1]._M_left;
    }
    disconnectDelegate(this,(QAbstractItemDelegate *)p_Var10);
  }
  if ((((QObject *)this->model != (QObject *)0x0) &&
      (pDVar3 = (this->selectionModel).wp.d, pDVar3 != (Data *)0x0)) &&
     (pQVar8 = (this->selectionModel).wp.value,
     pQVar8 != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0)) {
    if (*(int *)(pDVar3 + 4) == 0) {
      pQVar8 = (QObject *)0x0;
    }
    local_48 = QObject::destroyed;
    local_40 = 0;
    local_58 = QObject::deleteLater;
    local_50 = 0;
    QObject::disconnectImpl
              ((QObject *)this->model,&local_48,pQVar8,&local_58,
               (QMetaObject *)&QObject::staticMetaObject);
  }
  pDVar3 = (this->selectionModel).wp.d;
  if ((pDVar3 != (Data *)0x0) &&
     (pQVar8 = (this->selectionModel).wp.value,
     pQVar8 != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0)) {
    pQVar14 = (QObject *)0x0;
    if (*(int *)(pDVar3 + 4) == 0) {
      pQVar8 = pQVar14;
    }
    local_48 = QItemSelectionModel::selectionChanged;
    local_40 = 0;
    local_58 = (code *)0x249;
    local_50 = 0;
    QObject::disconnectImpl
              (pQVar8,&local_48,pQVar2,&local_58,
               (QMetaObject *)&QItemSelectionModel::staticMetaObject);
    pDVar3 = (this->selectionModel).wp.d;
    if (pDVar3 != (Data *)0x0) {
      if (*(int *)(pDVar3 + 4) == 0) {
        pQVar14 = (QObject *)0x0;
      }
      else {
        pQVar14 = (this->selectionModel).wp.value;
      }
    }
    local_48 = QItemSelectionModel::currentChanged;
    local_40 = 0;
    local_58 = (code *)0x251;
    local_50 = 0;
    QObject::disconnectImpl
              (pQVar14,&local_48,pQVar2,&local_58,
               (QMetaObject *)&QItemSelectionModel::staticMetaObject);
  }
  pDVar9 = (this->indexEditorHash).d;
  if (pDVar9 == (Data *)0x0) {
    pDVar9 = (Data *)0x0;
    uVar13 = 0;
LAB_0052f41f:
    if (pDVar9 == (Data *)0x0 && uVar13 == 0) goto LAB_0052f516;
  }
  else {
    if (pDVar9->spans->offsets[0] == 0xff) {
      uVar6 = 1;
      do {
        uVar13 = uVar6;
        if (pDVar9->numBuckets == uVar13) {
          pDVar9 = (Data *)0x0;
          uVar13 = 0;
          break;
        }
        uVar6 = uVar13 + 1;
      } while (pDVar9->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
      goto LAB_0052f41f;
    }
    uVar13 = 0;
  }
  do {
    pEVar5 = pDVar9->spans[uVar13 >> 7].entries;
    bVar1 = pDVar9->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f];
    if (((pEVar5[bVar1].storage.data[0x18] == '\0') &&
        (lVar11 = *(long *)(pEVar5[bVar1].storage.data + 8), lVar11 != 0)) &&
       ((*(int *)(lVar11 + 4) != 0 &&
        (pQVar8 = *(QObject **)(pEVar5[bVar1].storage.data + 0x10), pQVar8 != (QObject *)0x0)))) {
      if (*(int *)(lVar11 + 4) == 0) {
        pQVar8 = (QObject *)0x0;
      }
      local_48 = QObject::destroyed;
      local_40 = 0;
      local_58 = (code *)0x2a1;
      local_50 = 0;
      QObject::disconnectImpl
                (pQVar8,&local_48,pQVar2,&local_58,(QMetaObject *)&QObject::staticMetaObject);
    }
    do {
      if (pDVar9->numBuckets - 1 == uVar13) {
        pDVar9 = (Data *)0x0;
        uVar13 = 0;
        break;
      }
      uVar13 = uVar13 + 1;
    } while (pDVar9->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
  } while ((pDVar9 != (Data *)0x0) || (uVar13 != 0));
LAB_0052f516:
  QObject::disconnect(&this->scollerConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::disconnectAll()
{
    Q_Q(QAbstractItemView);
    for (const QMetaObject::Connection &connection : modelConnections)
        QObject::disconnect(connection);
    for (const QMetaObject::Connection &connection : scrollbarConnections)
      QObject::disconnect(connection);
    disconnectDelegate(itemDelegate);
    for (QAbstractItemDelegate *delegate : std::as_const(rowDelegates))
        disconnectDelegate(delegate);
    for (QAbstractItemDelegate *delegate : std::as_const(columnDelegates))
        disconnectDelegate(delegate);
    if (model && selectionModel) {
        QObject::disconnect(model, &QAbstractItemModel::destroyed,
                            selectionModel, &QItemSelectionModel::deleteLater);
    }
    if (selectionModel) {
        QObject::disconnect(selectionModel, &QItemSelectionModel::selectionChanged,
                            q, &QAbstractItemView::selectionChanged);
        QObject::disconnect(selectionModel, &QItemSelectionModel::currentChanged,
                            q, &QAbstractItemView::currentChanged);
    }
    for (const auto &info : std::as_const(indexEditorHash)) {
        if (!info.isStatic && info.widget)
            QObject::disconnect(info.widget, &QWidget::destroyed, q, &QAbstractItemView::editorDestroyed);
    }
#if QT_CONFIG(gestures) && QT_CONFIG(scroller)
    QObject::disconnect(scollerConnection);
#endif
}